

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O1

Fraig_NodeVec_t * Fraig_DfsNodes(Fraig_Man_t *pMan,Fraig_Node_t **ppNodes,int nNodes,int fEquiv)

{
  Fraig_NodeVec_t *vNodes;
  ulong uVar1;
  
  pMan->nTravIds = pMan->nTravIds + 1;
  vNodes = Fraig_NodeVecAlloc(100);
  if (0 < nNodes) {
    uVar1 = 0;
    do {
      Fraig_Dfs_rec(pMan,(Fraig_Node_t *)((ulong)ppNodes[uVar1] & 0xfffffffffffffffe),vNodes,fEquiv)
      ;
      uVar1 = uVar1 + 1;
    } while ((uint)nNodes != uVar1);
  }
  return vNodes;
}

Assistant:

Fraig_NodeVec_t * Fraig_DfsNodes( Fraig_Man_t * pMan, Fraig_Node_t ** ppNodes, int nNodes, int fEquiv )
{
    Fraig_NodeVec_t * vNodes;
    int i;
    pMan->nTravIds++;
    vNodes = Fraig_NodeVecAlloc( 100 );
    for ( i = 0; i < nNodes; i++ )
        Fraig_Dfs_rec( pMan, Fraig_Regular(ppNodes[i]), vNodes, fEquiv );
    return vNodes;
}